

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyDsd.c
# Opt level: O3

Ivy_Obj_t * Ivy_ManDsdConstruct_rec(Ivy_Man_t *p,Vec_Int_t *vFront,int iNode,Vec_Int_t *vTree)

{
  uint uVar1;
  int iVar2;
  Ivy_Obj_t *pIVar3;
  Ivy_Obj_t *pIVar4;
  Ivy_Obj_t *pIVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  Ivy_Obj_t *local_b8 [17];
  
  if ((-1 < iNode) && (iNode < vTree->nSize)) {
    uVar1 = vTree->pArray[(uint)iNode];
    uVar6 = uVar1 & 0xf;
    switch(uVar6) {
    case 0:
      if (iNode < vFront->nSize) {
        iVar2 = vFront->pArray[(uint)iNode];
        if ((-1 < (long)iVar2) && (iVar2 < p->vObjs->nSize)) {
          return (Ivy_Obj_t *)((ulong)(uVar1 >> 4 & 1) ^ (ulong)p->vObjs->pArray[iVar2]);
        }
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      goto LAB_007552bc;
    case 1:
      return (Ivy_Obj_t *)((ulong)(uVar1 >> 4 & 1) ^ (ulong)p->pConst1);
    case 2:
      pIVar3 = Ivy_ManDsdConstruct_rec(p,vFront,uVar1 >> 9 & 7,vTree);
      break;
    case 3:
    case 4:
      uVar8 = uVar1 >> 5 & 7;
      if (uVar8 != 0) {
        uVar7 = 0;
        do {
          if (uVar7 == 6) {
            __assert_fail("iNum >= 0 && iNum <= 5",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyDsd.c"
                          ,0x84,"unsigned int Ivy_DecGetVar(Ivy_Dec_t *, int)");
          }
          if ((uVar6 != 3) && ((uVar1 & 0x100) != 0)) {
            __assert_fail("Node.Type == IVY_DEC_AND || (Var & 1) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyDsd.c"
                          ,0x262,
                          "Ivy_Obj_t *Ivy_ManDsdConstruct_rec(Ivy_Man_t *, Vec_Int_t *, int, Vec_Int_t *)"
                         );
          }
          pIVar3 = Ivy_ManDsdConstruct_rec(p,vFront,(uVar1 >> 8 & 0xf) >> 1,vTree);
          local_b8[uVar7] = (Ivy_Obj_t *)((ulong)(uVar1 >> 8 & 1) ^ (ulong)pIVar3);
          uVar7 = uVar7 + 1;
        } while (uVar8 != uVar7);
      }
      pIVar3 = Ivy_Multi(p,local_b8,uVar8,(uVar6 != 3) + IVY_AND);
      break;
    default:
      if ((uVar1 & 0x10) != 0) {
        __assert_fail("Node.fCompl == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyDsd.c"
                      ,0x26d,
                      "Ivy_Obj_t *Ivy_ManDsdConstruct_rec(Ivy_Man_t *, Vec_Int_t *, int, Vec_Int_t *)"
                     );
      }
      if (1 < uVar6 - 5) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyDsd.c"
                      ,0x280,
                      "Ivy_Obj_t *Ivy_ManDsdConstruct_rec(Ivy_Man_t *, Vec_Int_t *, int, Vec_Int_t *)"
                     );
      }
      pIVar3 = Ivy_ManDsdConstruct_rec(p,vFront,uVar1 >> 9 & 7,vTree);
      pIVar4 = Ivy_ManDsdConstruct_rec(p,vFront,uVar1 >> 0xd & 7,vTree);
      pIVar5 = Ivy_ManDsdConstruct_rec(p,vFront,uVar1 >> 0x11 & 7,vTree);
      uVar8 = uVar1 >> 8 & 1;
      if (uVar8 != 0 && uVar6 != 6) {
        __assert_fail("Node.Type == IVY_DEC_MAJ || (VarC & 1) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyDsd.c"
                      ,0x277,
                      "Ivy_Obj_t *Ivy_ManDsdConstruct_rec(Ivy_Man_t *, Vec_Int_t *, int, Vec_Int_t *)"
                     );
      }
      pIVar3 = (Ivy_Obj_t *)((ulong)pIVar3 ^ (ulong)uVar8);
      pIVar4 = (Ivy_Obj_t *)((ulong)pIVar4 ^ (ulong)(uVar1 >> 0xc & 1));
      pIVar5 = (Ivy_Obj_t *)((ulong)pIVar5 ^ (ulong)(uVar1 >> 0x10 & 1));
      if (uVar6 == 5) {
        pIVar3 = Ivy_Mux(p,pIVar3,pIVar4,pIVar5);
        return pIVar3;
      }
      pIVar3 = Ivy_Maj(p,pIVar3,pIVar4,pIVar5);
      return pIVar3;
    }
    return (Ivy_Obj_t *)((ulong)(uVar1 >> 4 & 1) ^ (ulong)pIVar3);
  }
LAB_007552bc:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

Ivy_Obj_t * Ivy_ManDsdConstruct_rec( Ivy_Man_t * p, Vec_Int_t * vFront, int iNode, Vec_Int_t * vTree )
{
    Ivy_Obj_t * pResult, * pChild, * pNodes[16];
    int Var, i;
    // get the node
    Ivy_Dec_t Node = Ivy_IntToDec( Vec_IntEntry(vTree, iNode) );
    // compute the node function
    if ( Node.Type == IVY_DEC_CONST1 )
        return Ivy_NotCond( Ivy_ManConst1(p), Node.fCompl );
    if ( Node.Type == IVY_DEC_PI )
    {
        pResult = Ivy_ManObj( p, Vec_IntEntry(vFront, iNode) );
        return Ivy_NotCond( pResult, Node.fCompl );
    }
    if ( Node.Type == IVY_DEC_BUF )
    {
        pResult = Ivy_ManDsdConstruct_rec( p, vFront, Node.Fan0 >> 1, vTree );
        return Ivy_NotCond( pResult, Node.fCompl );
    }
    if ( Node.Type == IVY_DEC_AND || Node.Type == IVY_DEC_EXOR )
    {
        for ( i = 0; i < (int)Node.nFans; i++ )
        {
            Var = Ivy_DecGetVar( &Node, i );
            assert( Node.Type == IVY_DEC_AND || (Var & 1) == 0 );
            pChild = Ivy_ManDsdConstruct_rec( p, vFront, Var >> 1, vTree );
            pChild = Ivy_NotCond( pChild, (Var & 1) );
            pNodes[i] = pChild;
        }

//        Ivy_MultiEval( pNodes, Node.nFans, Node.Type == IVY_DEC_AND ? IVY_AND : IVY_EXOR );

        pResult = Ivy_Multi( p, pNodes, Node.nFans, Node.Type == IVY_DEC_AND ? IVY_AND : IVY_EXOR );
        return Ivy_NotCond( pResult, Node.fCompl );
    }
    assert( Node.fCompl == 0 );
    if ( Node.Type == IVY_DEC_MUX || Node.Type == IVY_DEC_MAJ )
    {
        int VarC, Var1, Var0;
        VarC = Ivy_DecGetVar( &Node, 0 );
        Var1 = Ivy_DecGetVar( &Node, 1 );
        Var0 = Ivy_DecGetVar( &Node, 2 );
        pNodes[0] = Ivy_ManDsdConstruct_rec( p, vFront, VarC >> 1, vTree );
        pNodes[1] = Ivy_ManDsdConstruct_rec( p, vFront, Var1 >> 1, vTree );
        pNodes[2] = Ivy_ManDsdConstruct_rec( p, vFront, Var0 >> 1, vTree );
        assert( Node.Type == IVY_DEC_MAJ || (VarC & 1) == 0 );
        pNodes[0] = Ivy_NotCond( pNodes[0], (VarC & 1) );
        pNodes[1] = Ivy_NotCond( pNodes[1], (Var1 & 1) );
        pNodes[2] = Ivy_NotCond( pNodes[2], (Var0 & 1) );
        if ( Node.Type == IVY_DEC_MUX )
            return Ivy_Mux( p, pNodes[0], pNodes[1], pNodes[2] );
        else
            return Ivy_Maj( p, pNodes[0], pNodes[1], pNodes[2] );
    }
    assert( 0 );
    return 0;
}